

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void __thiscall
gimage::TIFFImageIO::load
          (TIFFImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  long in_stack_00000398;
  long in_stack_000003a0;
  long in_stack_000003a8;
  int in_stack_000003b4;
  char *in_stack_000003b8;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_000003c0;
  long in_stack_000003d0;
  
  anon_unknown_6::loadInternal<float>
            (in_stack_000003c0,in_stack_000003b8,in_stack_000003b4,in_stack_000003a8,
             in_stack_000003a0,in_stack_00000398,in_stack_000003d0);
  return;
}

Assistant:

void TIFFImageIO::load(ImageFloat &image, const char *name, int ds, long x, long y, long w, long h) const
{
  loadInternal(image, name, ds, x, y, w, h);
}